

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O3

int run_test_tcp_close_reset_accepted(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  undefined8 *extraout_RDX;
  uv_tcp_t *in_RSI;
  
  loop = uv_default_loop();
  start_server(loop,in_RSI);
  client_close = 0;
  shutdown_before_close = 0;
  do_connect(loop,in_RSI);
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_0016f3d9;
    if (shutdown_cb_called != 0) goto LAB_0016f3de;
    in_RSI = (uv_tcp_t *)0x0;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016f3e3;
    if (write_cb_called != 4) goto LAB_0016f3e8;
    if (close_cb_called != 1) goto LAB_0016f3ed;
    if (shutdown_cb_called != 0) goto LAB_0016f3f2;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    in_RSI = (uv_tcp_t *)0x0;
    uv_run(puVar3,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_cold_1();
LAB_0016f3d9:
    run_test_tcp_close_reset_accepted_cold_2();
LAB_0016f3de:
    run_test_tcp_close_reset_accepted_cold_3();
LAB_0016f3e3:
    run_test_tcp_close_reset_accepted_cold_4();
LAB_0016f3e8:
    run_test_tcp_close_reset_accepted_cold_5();
LAB_0016f3ed:
    run_test_tcp_close_reset_accepted_cold_6();
LAB_0016f3f2:
    run_test_tcp_close_reset_accepted_cold_7();
  }
  run_test_tcp_close_reset_accepted_cold_8();
  loop = uv_default_loop();
  start_server(loop,in_RSI);
  client_close = 0;
  shutdown_before_close = 1;
  puVar3 = loop;
  do_connect(loop,in_RSI);
  iVar1 = (int)in_RSI;
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_0016f4b0;
    if (shutdown_cb_called != 0) goto LAB_0016f4b5;
    iVar1 = 0;
    puVar3 = loop;
    iVar2 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016f4ba;
    if (write_cb_called != 4) goto LAB_0016f4bf;
    if (close_cb_called != 0) goto LAB_0016f4c4;
    if (shutdown_cb_called != 1) goto LAB_0016f4c9;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    iVar1 = 0;
    uv_run(puVar3,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar2 = uv_loop_close(puVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_shutdown_cold_1();
LAB_0016f4b0:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_2();
LAB_0016f4b5:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_3();
LAB_0016f4ba:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_4();
LAB_0016f4bf:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_5();
LAB_0016f4c4:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_6();
LAB_0016f4c9:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_7();
  }
  run_test_tcp_close_reset_accepted_after_shutdown_cold_8();
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(loop,&tcp_accepted);
    if (iVar1 == 0) {
      iVar1 = uv_accept((uv_stream_t *)puVar3,(uv_stream_t *)&tcp_accepted);
      if (iVar1 == 0) {
        iVar1 = uv_read_start((uv_stream_t *)&tcp_accepted,alloc_cb,read_cb);
        return iVar1;
      }
      goto LAB_0016f52a;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_0016f52a:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return 0x336470;
}

Assistant:

TEST_IMPL(tcp_close_reset_accepted) {
  int r;

  loop = uv_default_loop();

  start_server(loop, &tcp_server);

  client_close = 0;
  shutdown_before_close = 0;

  do_connect(loop, &tcp_client);

  ASSERT(write_cb_called == 0);
  ASSERT(close_cb_called == 0);
  ASSERT(shutdown_cb_called == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(write_cb_called == 4);
  ASSERT(close_cb_called == 1);
  ASSERT(shutdown_cb_called == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}